

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O1

size_t ZSTD_compressBlock_fast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls)

{
  seqDef **ppsVar1;
  BYTE *iEnd;
  int *iStart;
  long *plVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  U32 *pUVar6;
  BYTE *pBVar7;
  BYTE *pBVar8;
  seqDef *psVar9;
  bool bVar10;
  char cVar11;
  U32 UVar12;
  uint uVar13;
  BYTE *op;
  BYTE *pBVar14;
  size_t sVar15;
  long lVar16;
  byte bVar17;
  uint uVar18;
  BYTE *pBVar19;
  ulong uVar20;
  int *piVar21;
  BYTE *pBVar22;
  uint uVar23;
  BYTE *ip;
  U32 UVar25;
  long *plVar26;
  ulong uVar27;
  U32 UVar28;
  ulong uVar29;
  U32 UVar30;
  int *piVar31;
  long *plVar32;
  long *plVar33;
  ulong uVar24;
  
  iEnd = (BYTE *)((long)src + srcSize);
  plVar2 = (long *)((long)src + (srcSize - 8));
  UVar28 = *rep;
  UVar30 = rep[1];
  if (src < plVar2) {
    pUVar6 = ms->hashTable;
    pBVar7 = (ms->window).base;
    pBVar8 = (ms->window).dictBase;
    uVar3 = (ms->window).lowLimit;
    uVar4 = (ms->window).dictLimit;
    iStart = (int *)(pBVar7 + uVar4);
    pBVar14 = pBVar8 + uVar4;
    uVar5 = (ms->cParams).targetLength;
    cVar11 = (char)(ms->cParams).hashLog;
    bVar17 = 0x20 - cVar11;
    ppsVar1 = &seqStore->sequences;
    plVar33 = (long *)src;
    do {
      uVar23 = mls - 5;
      uVar24 = (ulong)uVar23;
      switch(uVar24) {
      case 0:
        lVar16 = -0x30e4432345000000;
        break;
      case 1:
        lVar16 = -0x30e4432340650000;
        break;
      case 2:
        lVar16 = -0x30e44323405a9d00;
        break;
      case 3:
        uVar27 = *plVar33 * -0x30e44323485a9b9d;
        goto LAB_0045fd39;
      default:
        uVar27 = (ulong)((uint)((int)*plVar33 * -0x61c8864f) >> (bVar17 & 0x1f));
        goto LAB_0045fd41;
      }
      uVar27 = lVar16 * *plVar33;
LAB_0045fd39:
      uVar27 = uVar27 >> (0x40U - cVar11 & 0x3f);
LAB_0045fd41:
      uVar13 = pUVar6[uVar27];
      pBVar19 = pBVar7;
      if (uVar13 < uVar4) {
        pBVar19 = pBVar8;
      }
      uVar29 = (long)plVar33 - (long)pBVar7;
      UVar25 = (U32)uVar29;
      uVar18 = (UVar25 - UVar28) + 1;
      pBVar22 = pBVar7;
      if (uVar18 < uVar4) {
        pBVar22 = pBVar8;
      }
      pUVar6[uVar27] = UVar25;
      if ((uVar3 < uVar18 && 2 < (uVar4 - 1) - uVar18) &&
         (*(int *)(pBVar22 + uVar18) == *(int *)((long)plVar33 + 1))) {
        plVar26 = (long *)((long)plVar33 + 1);
        pBVar19 = iEnd;
        if (uVar18 < uVar4) {
          pBVar19 = pBVar14;
        }
        sVar15 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar33 + 5),(BYTE *)((long)(pBVar22 + uVar18) + 4),iEnd,
                            pBVar19,(BYTE *)iStart);
        uVar27 = (long)plVar26 - (long)src;
        plVar32 = (long *)seqStore->lit;
        plVar33 = (long *)((long)plVar32 + uVar27);
        do {
          *plVar32 = *src;
          plVar32 = plVar32 + 1;
          src = (void *)((long)src + 8);
        } while (plVar32 < plVar33);
        seqStore->lit = seqStore->lit + uVar27;
        if (0xffff < uVar27) {
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        lVar16 = sVar15 + 4;
        uVar20 = sVar15 + 1;
        psVar9 = *ppsVar1;
        psVar9->litLength = (U16)uVar27;
        psVar9->offset = 1;
        UVar12 = UVar28;
joined_r0x00460081:
        UVar28 = UVar12;
        if (0xffff < uVar20) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar9 - (long)seqStore->sequencesStart) >> 3);
        }
        src = (void *)(lVar16 + (long)plVar26);
        psVar9->matchLength = (U16)uVar20;
        *ppsVar1 = psVar9 + 1;
        plVar33 = (long *)src;
        if (src <= plVar2) {
          if (uVar23 < 4) {
            sVar15 = (*(code *)(&DAT_0056bfd0 + *(int *)(&DAT_0056bfd0 + uVar24 * 4)))();
            return sVar15;
          }
          pUVar6[(uint)(*(int *)(pBVar7 + (uVar29 & 0xffffffff) + 2) * -0x61c8864f) >>
                 (bVar17 & 0x1f)] = UVar25 + 2;
          if (uVar23 < 4) {
            sVar15 = (*(code *)(&DAT_0056bfe0 + *(int *)(&DAT_0056bfe0 + uVar24 * 4)))();
            return sVar15;
          }
          pUVar6[(uint)(*(int *)((long)src + -2) * -0x61c8864f) >> (bVar17 & 0x1f)] =
               (int)(int *)((long)src + -2) - (int)pBVar7;
          do {
            if (plVar2 < plVar33) break;
            UVar25 = (int)plVar33 - (int)pBVar7;
            uVar13 = UVar25 - UVar30;
            pBVar19 = pBVar7;
            if (uVar13 < uVar4) {
              pBVar19 = pBVar8;
            }
            if ((uVar3 < uVar13 && 2 < (uVar4 - 1) - uVar13) &&
               (*(int *)(pBVar19 + uVar13) == (int)*plVar33)) {
              pBVar22 = iEnd;
              if (uVar13 < uVar4) {
                pBVar22 = pBVar14;
              }
              sVar15 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar33 + 4),(BYTE *)((long)(pBVar19 + uVar13) + 4)
                                  ,iEnd,pBVar22,(BYTE *)iStart);
              *(long *)seqStore->lit = *src;
              psVar9 = seqStore->sequences;
              psVar9->litLength = 0;
              psVar9->offset = 1;
              if (0xffff < sVar15 + 1) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar9 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar9->matchLength = (U16)(sVar15 + 1);
              seqStore->sequences = psVar9 + 1;
              if (uVar23 < 4) {
                sVar15 = (*(code *)(&DAT_0056bff0 + *(int *)(&DAT_0056bff0 + uVar24 * 4)))();
                return sVar15;
              }
              pUVar6[(uint)((int)*plVar33 * -0x61c8864f) >> (bVar17 & 0x1f)] = UVar25;
              src = (void *)((long)plVar33 + sVar15 + 4);
              bVar10 = true;
              plVar33 = (long *)src;
              UVar25 = UVar30;
              UVar30 = UVar28;
            }
            else {
              bVar10 = false;
              UVar25 = UVar28;
            }
            UVar28 = UVar25;
          } while (bVar10);
        }
      }
      else {
        if ((uVar3 <= uVar13) && (piVar21 = (int *)(pBVar19 + uVar13), *piVar21 == (int)*plVar33)) {
          piVar31 = iStart;
          pBVar22 = iEnd;
          if (uVar13 < uVar4) {
            piVar31 = (int *)(pBVar8 + uVar3);
            pBVar22 = pBVar14;
          }
          sVar15 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar33 + 4),(BYTE *)(piVar21 + 1),iEnd,pBVar22,
                              (BYTE *)iStart);
          lVar16 = sVar15 + 4;
          plVar26 = plVar33;
          if ((piVar31 < piVar21) && (src < plVar33)) {
            piVar21 = (int *)(pBVar19 + uVar13);
            do {
              plVar32 = (long *)((long)plVar33 + -1);
              piVar21 = (int *)((long)piVar21 + -1);
              plVar26 = plVar33;
              if ((*(BYTE *)plVar32 != *(BYTE *)piVar21) ||
                 (lVar16 = lVar16 + 1, plVar26 = plVar32, piVar21 <= piVar31)) break;
              plVar33 = plVar32;
            } while (src < plVar32);
          }
          uVar27 = (long)plVar26 - (long)src;
          plVar32 = (long *)seqStore->lit;
          plVar33 = (long *)((long)plVar32 + uVar27);
          do {
            *plVar32 = *src;
            plVar32 = plVar32 + 1;
            src = (void *)((long)src + 8);
          } while (plVar32 < plVar33);
          seqStore->lit = seqStore->lit + uVar27;
          if (0xffff < uVar27) {
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          uVar20 = lVar16 - 3;
          psVar9 = *ppsVar1;
          psVar9->litLength = (U16)uVar27;
          psVar9->offset = (UVar25 - uVar13) + 3;
          UVar12 = UVar25 - uVar13;
          UVar30 = UVar28;
          goto joined_r0x00460081;
        }
        plVar33 = (long *)((long)plVar33 +
                          ((long)plVar33 - (long)src >> 8) + (ulong)(uVar5 + (uVar5 == 0)));
      }
    } while (plVar33 < plVar2);
  }
  *rep = UVar28;
  rep[1] = UVar30;
  return (long)iEnd - (long)src;
}

Assistant:

static size_t ZSTD_compressBlock_fast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize, U32 const mls)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashTable = ms->hashTable;
    U32 const hlog = cParams->hashLog;
    /* support stepSize of 0 */
    U32 const stepSize = cParams->targetLength + !(cParams->targetLength);
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const U32   dictStartIndex = ms->window.lowLimit;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const U32   prefixStartIndex = ms->window.dictLimit;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    U32 offset_1=rep[0], offset_2=rep[1];

    /* Search Loop */
    while (ip < ilimit) {  /* < instead of <=, because (ip+1) */
        const size_t h = ZSTD_hashPtr(ip, hlog, mls);
        const U32    matchIndex = hashTable[h];
        const BYTE* const matchBase = matchIndex < prefixStartIndex ? dictBase : base;
        const BYTE*  match = matchBase + matchIndex;
        const U32    current = (U32)(ip-base);
        const U32    repIndex = current + 1 - offset_1;
        const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
        const BYTE* const repMatch = repBase + repIndex;
        size_t mLength;
        hashTable[h] = current;   /* update hash table */
        assert(offset_1 <= current +1);   /* check repIndex */

        if ( (((U32)((prefixStartIndex-1) - repIndex) >= 3) /* intentional underflow */ & (repIndex > dictStartIndex))
           && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
            const BYTE* repMatchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
            mLength = ZSTD_count_2segments(ip+1+4, repMatch+4, iend, repMatchEnd, prefixStart) + 4;
            ip++;
            ZSTD_storeSeq(seqStore, ip-anchor, anchor, 0, mLength-MINMATCH);
        } else {
            if ( (matchIndex < dictStartIndex) ||
                 (MEM_read32(match) != MEM_read32(ip)) ) {
                assert(stepSize >= 1);
                ip += ((ip-anchor) >> kSearchStrength) + stepSize;
                continue;
            }
            {   const BYTE* matchEnd = matchIndex < prefixStartIndex ? dictEnd : iend;
                const BYTE* lowMatchPtr = matchIndex < prefixStartIndex ? dictStart : prefixStart;
                U32 offset;
                mLength = ZSTD_count_2segments(ip+4, match+4, iend, matchEnd, prefixStart) + 4;
                while (((ip>anchor) & (match>lowMatchPtr)) && (ip[-1] == match[-1])) { ip--; match--; mLength++; }   /* catch up */
                offset = current - matchIndex;
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, ip-anchor, anchor, offset + ZSTD_REP_MOVE, mLength-MINMATCH);
        }   }

        /* found a match : store it */
        ip += mLength;
        anchor = ip;

        if (ip <= ilimit) {
            /* Fill Table */
            hashTable[ZSTD_hashPtr(base+current+2, hlog, mls)] = current+2;
            hashTable[ZSTD_hashPtr(ip-2, hlog, mls)] = (U32)(ip-2-base);
            /* check immediate repcode */
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex2 = current2 - offset_2;
                const BYTE* repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
                if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3) & (repIndex2 > dictStartIndex))  /* intentional overflow */
                   && (MEM_read32(repMatch2) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                    size_t const repLength2 = ZSTD_count_2segments(ip+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                    U32 tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset;   /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0, anchor, 0, repLength2-MINMATCH);
                    hashTable[ZSTD_hashPtr(ip, hlog, mls)] = current2;
                    ip += repLength2;
                    anchor = ip;
                    continue;
                }
                break;
    }   }   }

    /* save reps for next block */
    rep[0] = offset_1;
    rep[1] = offset_2;

    /* Return the last literals size */
    return iend - anchor;
}